

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.cpp
# Opt level: O1

bool __thiscall pstore::indirect_string::equal_contents(indirect_string *this,indirect_string *rhs)

{
  long lVar1;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  raw_sstring_view rVar5;
  raw_sstring_view rVar6;
  shared_sstring_view rhs_owner;
  shared_sstring_view lhs_owner;
  sstring_view<std::shared_ptr<const_char>_> local_78;
  sstring_view<std::shared_ptr<const_char>_> local_58;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_38;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_30;
  
  local_30.ptr_ = &local_58;
  local_58.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_58.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58.size_ = 0;
  local_78.size_ = 0;
  local_78.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_78.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::ensure_invariant(&local_30);
  rVar5 = as_string_view(this,local_30);
  local_38.ptr_ = &local_78;
  gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::ensure_invariant(&local_38);
  rVar6 = as_string_view(rhs,local_38);
  sVar2 = rVar6.size_;
  if (rVar5.size_ == sVar2) {
    if (sVar2 == 0) {
      bVar3 = true;
    }
    else {
      lVar1 = 0;
      do {
        bVar3 = rVar6.ptr_[lVar1] == rVar5.ptr_[lVar1];
        if (!bVar3) break;
        bVar4 = sVar2 - 1 != lVar1;
        lVar1 = lVar1 + 1;
      } while (bVar4);
    }
  }
  else {
    bVar3 = false;
  }
  if (local_78.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_58.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return bVar3;
}

Assistant:

bool indirect_string::equal_contents (indirect_string const & rhs) const {
        shared_sstring_view lhs_owner;
        shared_sstring_view rhs_owner;
        return this->as_string_view (&lhs_owner) == rhs.as_string_view (&rhs_owner);
    }